

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O2

uint32_t __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::DecryptionTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::readBool(TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::DecryptionTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
           *this,reference value)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong *puVar3;
  bool b;
  bool local_19;
  
  puVar3 = value._M_p;
  local_19 = false;
  uVar1 = TCompactProtocolT<duckdb::DecryptionTransport>::readBool
                    ((TCompactProtocolT<duckdb::DecryptionTransport> *)this,&local_19);
  if (local_19 == true) {
    uVar2 = value._M_mask | *puVar3;
  }
  else {
    uVar2 = ~value._M_mask & *puVar3;
  }
  *puVar3 = uVar2;
  return uVar1;
}

Assistant:

uint32_t readBool(duckdb::vector<bool>::reference value) {
    bool b = false;
    uint32_t ret = static_cast<Protocol_*>(this)->readBool(b);
    value = b;
    return ret;
  }